

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdsmf.c
# Opt level: O2

DUH * dumb_read_riff_dsmf(DUMBFILE *f,riff *stream)

{
  byte *pbVar1;
  riff_chunk *prVar2;
  IT_SAMPLE *pIVar3;
  char cVar4;
  uchar uVar5;
  int iVar6;
  int32 iVar7;
  int32 iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int value;
  DUMB_IT_SIGDATA *sigdata_00;
  uchar *puVar12;
  IT_PATTERN *pIVar13;
  IT_SAMPLE *pIVar14;
  char *ptr;
  IT_ENTRY *entry;
  DUH *pDVar15;
  uchar uVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  uint n;
  bool bVar22;
  DUH_SIGTYPE_DESC *descptr;
  sigdata_t *sigdata;
  char *tag [2] [2];
  
  descptr = &_dumb_sigtype_it;
  if ((stream != (riff *)0x0) && (stream->type == 0x44534d46)) {
    sigdata_00 = (DUMB_IT_SIGDATA *)malloc(0x138);
    iVar6 = 0;
    if (sigdata_00 == (DUMB_IT_SIGDATA *)0x0) {
      return (DUH *)0x0;
    }
    sigdata_00->n_samples = 0;
    sigdata_00->n_patterns = 0;
    sigdata_00->name[0] = '\0';
    uVar20 = (ulong)stream->chunk_count;
    iVar17 = 0;
    bVar22 = false;
    for (lVar21 = 0; uVar20 * 0x18 - lVar21 != 0; lVar21 = lVar21 + 0x18) {
      iVar11 = *(int *)((long)&stream->chunks->type + lVar21);
      if (iVar11 == 0x494e5354) {
        iVar17 = iVar17 + 1;
        sigdata_00->n_samples = iVar17;
      }
      else if (iVar11 == 0x50415454) {
        iVar6 = iVar6 + 1;
        sigdata_00->n_patterns = iVar6;
      }
      else if ((iVar11 == 0x534f4e47) &&
              ((bVar22 || (bVar22 = true, *(uint *)((long)&stream->chunks->size + lVar21) < 0xc0))))
      goto LAB_0064036b;
    }
    if ((((iVar17 == 0 || !bVar22) || (0xff < iVar6)) || (iVar6 == 0)) || (0xff < iVar17)) {
LAB_0064036b:
      free(sigdata_00);
    }
    else {
      sigdata_00->song_message = (uchar *)0x0;
      sigdata_00->n_orders = 0;
      sigdata_00->n_instruments = 0;
      sigdata_00->order = (uchar *)0x0;
      sigdata_00->instrument = (IT_INSTRUMENT *)0x0;
      sigdata_00->sample = (IT_SAMPLE *)0x0;
      sigdata_00->pattern = (IT_PATTERN *)0x0;
      sigdata_00->midi = (IT_MIDI *)0x0;
      sigdata_00->checkpoint = (IT_CHECKPOINT *)0x0;
      sigdata_00->mixing_volume = 0x30;
      sigdata_00->pan_separation = 0x80;
      sigdata_00->restart_position = '\0';
      builtin_memcpy(sigdata_00->channel_volume,
                     "@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@",0x40);
      cVar4 = (char)((dumb_it_default_panning_separation << 5) / 100);
      uVar16 = ' ' - cVar4;
      uVar5 = cVar4 + ' ';
      for (uVar19 = 0; uVar19 < 0x40; uVar19 = uVar19 + 4) {
        sigdata_00->channel_pan[uVar19] = uVar16;
        sigdata_00->channel_pan[uVar19 + 1] = uVar5;
        sigdata_00->channel_pan[uVar19 + 2] = uVar5;
        sigdata_00->channel_pan[uVar19 + 3] = uVar16;
      }
      for (uVar19 = 0; uVar19 < uVar20; uVar19 = uVar19 + 1) {
        if (stream->chunks[uVar19].type == 0x534f4e47) {
          iVar6 = dumbfile_seek(f,(long)stream->chunks[uVar19].offset,0);
          if (iVar6 != 0) goto LAB_006409de;
          dumbfile_getnc((char *)sigdata_00,0x1c,f);
          sigdata_00->name[0x1c] = '\0';
          sigdata_00->flags = 0x31;
          dumbfile_skip(f,8);
          iVar6 = dumbfile_igetw(f);
          sigdata_00->n_orders = iVar6;
          dumbfile_skip(f,4);
          iVar6 = dumbfile_igetw(f);
          sigdata_00->n_pchannels = iVar6;
          iVar6 = dumbfile_getc(f);
          sigdata_00->global_volume = iVar6;
          iVar6 = dumbfile_getc(f);
          sigdata_00->mixing_volume = iVar6;
          iVar6 = dumbfile_getc(f);
          sigdata_00->speed = iVar6;
          iVar6 = dumbfile_getc(f);
          sigdata_00->tempo = iVar6;
          for (lVar21 = 0; lVar21 != 0x10; lVar21 = lVar21 + 1) {
            iVar6 = dumbfile_getc(f);
            sigdata_00->channel_pan[lVar21] = (uchar)(iVar6 / 2);
          }
          puVar12 = (uchar *)malloc(0x80);
          sigdata_00->order = puVar12;
          if (puVar12 == (uchar *)0x0) goto LAB_006409de;
          dumbfile_getnc((char *)puVar12,0x80,f);
          uVar20 = (ulong)stream->chunk_count;
        }
      }
      uVar9 = sigdata_00->n_patterns;
      pIVar13 = (IT_PATTERN *)malloc((long)(int)uVar9 << 4);
      sigdata_00->pattern = pIVar13;
      if (pIVar13 != (IT_PATTERN *)0x0) {
        uVar18 = 0;
        uVar19 = (ulong)uVar9;
        if ((int)uVar9 < 1) {
          uVar19 = uVar18;
        }
        for (; uVar19 * 0x10 != uVar18; uVar18 = uVar18 + 0x10) {
          *(undefined8 *)((long)&pIVar13->entry + uVar18) = 0;
        }
        uVar9 = sigdata_00->n_samples;
        pIVar14 = (IT_SAMPLE *)malloc((long)(int)uVar9 * 0x68);
        sigdata_00->sample = pIVar14;
        if (pIVar14 != (IT_SAMPLE *)0x0) {
          uVar18 = 0;
          uVar19 = (ulong)uVar9;
          if ((int)uVar9 < 1) {
            uVar19 = uVar18;
          }
          for (; uVar19 * 0x68 - uVar18 != 0; uVar18 = uVar18 + 0x68) {
            puVar12 = pIVar14->filename + uVar18 + 0x35;
            puVar12[0] = '\0';
            puVar12[1] = '\0';
            puVar12[2] = '\0';
            puVar12[3] = '\0';
            puVar12[4] = '\0';
            puVar12[5] = '\0';
            puVar12[6] = '\0';
            puVar12[7] = '\0';
          }
          sigdata_00->n_samples = 0;
          sigdata_00->n_patterns = 0;
          uVar19 = 0;
          do {
            if (uVar20 <= uVar19) {
              _dumb_it_fix_invalid_orders(sigdata_00);
              tag[0][0] = "TITLE";
              tag[1][0] = "FORMAT";
              tag[1][1] = "RIFF DSMF";
              sigdata = sigdata_00;
              tag[0][1] = (char *)sigdata_00;
              pDVar15 = make_duh(-1,2,tag,1,&descptr,&sigdata);
              return pDVar15;
            }
            prVar2 = stream->chunks;
            if (prVar2[uVar19].type == 0x494e5354) {
              iVar6 = dumbfile_seek(f,(long)prVar2[uVar19].offset,0);
              if (iVar6 != 0) break;
              pIVar3 = sigdata_00->sample;
              iVar6 = sigdata_00->n_samples;
              pIVar14 = pIVar3 + iVar6;
              uVar9 = prVar2[uVar19].size;
              dumbfile_getnc((char *)pIVar3[iVar6].filename,0xd,f);
              pIVar3[iVar6].filename[0xe] = '\0';
              uVar10 = dumbfile_igetw(f);
              iVar17 = dumbfile_getc(f);
              pIVar3[iVar6].default_volume = (uchar)iVar17;
              iVar7 = dumbfile_igetl(f);
              pIVar3[iVar6].length = iVar7;
              iVar7 = dumbfile_igetl(f);
              pIVar3[iVar6].loop_start = iVar7;
              iVar7 = dumbfile_igetl(f);
              pIVar3[iVar6].loop_end = iVar7;
              dumbfile_skip(f,4);
              iVar17 = dumbfile_igetw(f);
              pIVar3[iVar6].C5_speed = iVar17 * 2;
              dumbfile_skip(f,2);
              dumbfile_getnc((char *)pIVar14,0x1c,f);
              pIVar3[iVar6].name[0x1c] = '\0';
              n = pIVar3[iVar6].length;
              if (n == 0) {
                pIVar14->flags = pIVar14->flags & 0xfe;
              }
              else {
                if ((int)uVar9 < (int)(n + 0x40)) break;
                pIVar14->flags = '\x01';
                pIVar14->global_volume = '@';
                pIVar14->default_pan = '\0';
                pIVar14->vibrato_speed = '\0';
                pIVar14->vibrato_depth = '\0';
                pIVar14->vibrato_rate = '\0';
                pIVar14->vibrato_waveform = '\0';
                pIVar14->finetune = 0;
                pIVar14->max_resampling_quality = -1;
                if ((((uVar10 & 1) != 0) && (uVar9 = pIVar14->loop_end, uVar9 <= n)) &&
                   ((uint)pIVar14->loop_start < uVar9)) {
                  pIVar14->length = uVar9;
                  pIVar14->flags = ((byte)uVar10 & 0x10) << 2 | 0x11;
                  n = uVar9;
                }
                ptr = (char *)malloc((long)(int)n);
                pIVar14->data = ptr;
                if (ptr == (char *)0x0) break;
                dumbfile_getnc(ptr,n,f);
                if ((uVar10 & 2) == 0) {
                  for (lVar21 = 0; lVar21 < pIVar14->length; lVar21 = lVar21 + 1) {
                    pbVar1 = (byte *)((long)pIVar14->data + lVar21);
                    *pbVar1 = *pbVar1 ^ 0x80;
                  }
                }
              }
              sigdata_00->n_samples = sigdata_00->n_samples + 1;
            }
            else if (prVar2[uVar19].type == 0x50415454) {
              iVar6 = dumbfile_seek(f,(long)prVar2[uVar19].offset,0);
              if (iVar6 != 0) break;
              pIVar13 = sigdata_00->pattern + sigdata_00->n_patterns;
              uVar9 = prVar2[uVar19].size;
              iVar6 = dumbfile_igetw(f);
              if ((int)uVar9 < iVar6) break;
              pIVar13->n_rows = 0x40;
              pIVar13->n_entries = 0x40;
              iVar7 = dumbfile_pos(f);
              lVar21 = (long)iVar6 + (long)iVar7 + -2;
              for (iVar6 = 0; iVar6 != 0x40; iVar6 = iVar6 + 1) {
                while( true ) {
                  iVar17 = dumbfile_error(f);
                  if ((iVar17 != 0) || (iVar8 = dumbfile_pos(f), lVar21 <= iVar8))
                  goto LAB_00640859;
                  uVar9 = dumbfile_getc(f);
                  if (uVar9 == 0) break;
                  if ((uVar9 & 0xf0) != 0) {
                    pIVar13->n_entries = pIVar13->n_entries + 1;
                    if ((char)uVar9 < '\0') {
                      dumbfile_skip(f,1);
                    }
                    if ((uVar9 & 0x40) != 0) {
                      dumbfile_skip(f,1);
                    }
                    if ((uVar9 & 0x20) != 0) {
                      dumbfile_skip(f,1);
                    }
                    if ((uVar9 & 0x10) != 0) {
                      dumbfile_skip(f,2);
                    }
                  }
                }
              }
LAB_00640859:
              if ((long)pIVar13->n_entries != 0x40) {
                entry = (IT_ENTRY *)malloc((long)pIVar13->n_entries * 7);
                pIVar13->entry = entry;
                if ((entry == (IT_ENTRY *)0x0) ||
                   (iVar6 = dumbfile_seek(f,(long)iVar7,0), iVar6 != 0)) break;
                iVar6 = 0x40;
                for (iVar17 = 0; iVar17 != 0x40; iVar17 = iVar17 + 1) {
                  while( true ) {
                    iVar11 = dumbfile_error(f);
                    if ((iVar11 != 0) || (iVar7 = dumbfile_pos(f), lVar21 <= iVar7))
                    goto LAB_0064098c;
                    uVar9 = dumbfile_getc(f);
                    if (uVar9 == 0) break;
                    entry->channel = (byte)uVar9 & 0xf;
                    entry->mask = '\0';
                    if ((uVar9 & 0xf0) != 0) {
                      if (((char)(byte)uVar9 < '\0') && (iVar11 = dumbfile_getc(f), iVar11 != 0)) {
                        entry->mask = entry->mask | 1;
                        entry->note = (char)iVar11 + 0xff;
                      }
                      if (((uVar9 & 0x40) != 0) && (iVar11 = dumbfile_getc(f), iVar11 != 0)) {
                        entry->mask = entry->mask | 2;
                        entry->instrument = (uchar)iVar11;
                      }
                      if ((uVar9 & 0x20) != 0) {
                        entry->mask = entry->mask | 4;
                        iVar11 = dumbfile_getc(f);
                        entry->volpan = (uchar)iVar11;
                      }
                      if ((uVar9 & 0x10) != 0) {
                        iVar11 = dumbfile_getc(f);
                        value = dumbfile_getc(f);
                        _dumb_it_xm_convert_effect(iVar11,value,entry,0);
                      }
                      if (entry->mask != '\0') {
                        entry = entry + 1;
                      }
                    }
                  }
                  entry->channel = 0xff;
                  entry = entry + 1;
                  iVar6 = iVar6 + -1;
                }
LAB_0064098c:
                lVar21 = -(long)entry;
                while (bVar22 = iVar6 != 0, iVar6 = iVar6 + -1, bVar22) {
                  entry->channel = 0xff;
                  entry = entry + 1;
                  lVar21 = lVar21 + -7;
                }
                iVar6 = (int)(-(long)(&pIVar13->entry->channel + lVar21) / 7);
                pIVar13->n_entries = iVar6;
                if (iVar6 == 0) break;
              }
              sigdata_00->n_patterns = sigdata_00->n_patterns + 1;
            }
            uVar19 = uVar19 + 1;
            uVar20 = (ulong)stream->chunk_count;
          } while( true );
        }
      }
LAB_006409de:
      _dumb_it_unload_sigdata(sigdata_00);
    }
  }
  return (DUH *)0x0;
}

Assistant:

DUH *dumb_read_riff_dsmf( DUMBFILE * f, struct riff * stream )
{
	sigdata_t *sigdata;

	DUH_SIGTYPE_DESC *descptr = &_dumb_sigtype_it;

    sigdata = it_riff_dsmf_load_sigdata( f, stream );

	if (!sigdata)
		return NULL;

	{
		const char *tag[2][2];
		tag[0][0] = "TITLE";
        tag[0][1] = (const char *)(((DUMB_IT_SIGDATA *)sigdata)->name);
		tag[1][0] = "FORMAT";
		tag[1][1] = "RIFF DSMF";
		return make_duh( -1, 2, ( const char * const (*) [ 2 ] ) tag, 1, & descptr, & sigdata );
	}
}